

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O0

void __thiscall CExtPubKey::Encode(CExtPubKey *this,uchar *code)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  uchar *puVar10;
  undefined1 *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  uchar *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RSI = *(undefined1 *)(in_RDI + 4);
  *(undefined4 *)(in_RSI + 1) = *(undefined4 *)(in_RDI + 5);
  WriteBE32(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  puVar10 = base_blob<256U>::begin
                      ((base_blob<256U> *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  *(undefined8 *)(in_RSI + 9) = *(undefined8 *)puVar10;
  *(undefined8 *)(in_RSI + 0x11) = *(undefined8 *)(puVar10 + 8);
  *(undefined8 *)(in_RSI + 0x19) = *(undefined8 *)(puVar10 + 0x10);
  *(undefined8 *)(in_RSI + 0x21) = *(undefined8 *)(puVar10 + 0x18);
  uVar9 = CPubKey::size((CPubKey *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (uVar9 != 0x21) {
    __assert_fail("pubkey.size() == CPubKey::COMPRESSED_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/pubkey.cpp"
                  ,0x17a,"void CExtPubKey::Encode(unsigned char *) const");
  }
  puVar10 = CPubKey::begin((CPubKey *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
  ;
  in_RSI[0x49] = puVar10[0x20];
  uVar2 = *(undefined4 *)puVar10;
  uVar3 = *(undefined4 *)(puVar10 + 4);
  uVar4 = *(undefined4 *)(puVar10 + 8);
  uVar5 = *(undefined4 *)(puVar10 + 0xc);
  uVar6 = *(undefined4 *)(puVar10 + 0x14);
  uVar7 = *(undefined4 *)(puVar10 + 0x18);
  uVar8 = *(undefined4 *)(puVar10 + 0x1c);
  *(undefined4 *)(in_RSI + 0x39) = *(undefined4 *)(puVar10 + 0x10);
  *(undefined4 *)(in_RSI + 0x3d) = uVar6;
  *(undefined4 *)(in_RSI + 0x41) = uVar7;
  *(undefined4 *)(in_RSI + 0x45) = uVar8;
  *(undefined4 *)(in_RSI + 0x29) = uVar2;
  *(undefined4 *)(in_RSI + 0x2d) = uVar3;
  *(undefined4 *)(in_RSI + 0x31) = uVar4;
  *(undefined4 *)(in_RSI + 0x35) = uVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CExtPubKey::Encode(unsigned char code[BIP32_EXTKEY_SIZE]) const {
    code[0] = nDepth;
    memcpy(code+1, vchFingerprint, 4);
    WriteBE32(code+5, nChild);
    memcpy(code+9, chaincode.begin(), 32);
    assert(pubkey.size() == CPubKey::COMPRESSED_SIZE);
    memcpy(code+41, pubkey.begin(), CPubKey::COMPRESSED_SIZE);
}